

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,bool closed,float thickness)

{
  ImVec2 IVar1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  undefined8 *puVar6;
  ImVec2 *pIVar7;
  ImDrawIdx IVar8;
  ImDrawIdx IVar9;
  ImVec2 *pIVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  ImVec2 IVar14;
  ImVec2 IStack_278;
  ImVec2 IStack_270;
  int in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffd9c;
  int iVar15;
  ImDrawList *in_stack_fffffffffffffda0;
  uint local_218;
  int local_214;
  int local_1e4;
  uint local_1e0;
  float inv_len_3;
  float d2_3;
  float dy_1;
  float dx_1;
  ImVec2 *p2;
  ImVec2 *p1;
  int local_1a8;
  int i2_3;
  int i1_3;
  int vtx_count_1;
  int idx_count_1;
  int i_1;
  ImVec2 *out_vtx_1;
  float dm_in_y;
  float dm_in_x;
  float dm_out_y;
  float dm_out_x;
  float inv_len_2;
  float d2_2;
  float dm_y_1;
  float dm_x_1;
  uint idx2_1;
  int i2_2;
  int i1_2;
  uint idx1_1;
  int local_dc;
  float half_inner_thickness;
  int i;
  ImVec2 *out_vtx;
  float inv_len_1;
  float d2_1;
  float dm_y;
  float dm_x;
  uint idx2;
  int i2_1;
  int i1_1;
  uint idx1;
  float inv_len;
  float d2;
  float dy;
  float dx;
  int i2;
  int i1;
  ImVec2 *temp_points;
  ImVec2 *temp_normals;
  int vtx_count;
  int idx_count;
  ImU32 col_trans;
  float AA_SIZE;
  bool thick_line;
  int count;
  ImVec2 uv;
  float thickness_local;
  bool closed_local;
  ImU32 col_local;
  int points_count_local;
  ImVec2 *points_local;
  ImDrawList *this_local;
  
  if (1 < points_count) {
    IVar1 = this->_Data->TexUvWhitePixel;
    AA_SIZE = (float)points_count;
    if (!closed) {
      AA_SIZE = (float)(points_count + -1);
    }
    bVar2 = 1.0 < thickness;
    if ((this->Flags & 1U) == 0) {
      PrimReserve(in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98);
      for (local_1a8 = 0; local_1a8 < (int)AA_SIZE; local_1a8 = local_1a8 + 1) {
        if (local_1a8 + 1 == points_count) {
          IStack_270.y = 0.0;
        }
        else {
          IStack_270.y = (float)(local_1a8 + 1);
        }
        pIVar7 = points + local_1a8;
        pIVar10 = points + (int)IStack_270.y;
        d2_3 = pIVar10->x - pIVar7->x;
        inv_len_3 = pIVar10->y - pIVar7->y;
        if (0.0 < d2_3 * d2_3 + inv_len_3 * inv_len_3) {
          fVar11 = ImSqrt(0.0);
          d2_3 = (1.0 / fVar11) * d2_3;
          inv_len_3 = (1.0 / fVar11) * inv_len_3;
        }
        fVar11 = thickness * 0.5 * d2_3;
        fVar12 = thickness * 0.5 * inv_len_3;
        (this->_VtxWritePtr->pos).x = pIVar7->x + fVar12;
        (this->_VtxWritePtr->pos).y = pIVar7->y - fVar11;
        this->_VtxWritePtr->uv = IVar1;
        this->_VtxWritePtr->col = col;
        this->_VtxWritePtr[1].pos.x = pIVar10->x + fVar12;
        this->_VtxWritePtr[1].pos.y = pIVar10->y - fVar11;
        this->_VtxWritePtr[1].uv = IVar1;
        this->_VtxWritePtr[1].col = col;
        this->_VtxWritePtr[2].pos.x = pIVar10->x - fVar12;
        this->_VtxWritePtr[2].pos.y = pIVar10->y + fVar11;
        this->_VtxWritePtr[2].uv = IVar1;
        this->_VtxWritePtr[2].col = col;
        this->_VtxWritePtr[3].pos.x = pIVar7->x - fVar12;
        this->_VtxWritePtr[3].pos.y = pIVar7->y + fVar11;
        this->_VtxWritePtr[3].uv = IVar1;
        this->_VtxWritePtr[3].col = col;
        this->_VtxWritePtr = this->_VtxWritePtr + 4;
        *this->_IdxWritePtr = (ImDrawIdx)this->_VtxCurrentIdx;
        this->_IdxWritePtr[1] = (short)this->_VtxCurrentIdx + 1;
        this->_IdxWritePtr[2] = (short)this->_VtxCurrentIdx + 2;
        this->_IdxWritePtr[3] = (ImDrawIdx)this->_VtxCurrentIdx;
        this->_IdxWritePtr[4] = (short)this->_VtxCurrentIdx + 2;
        this->_IdxWritePtr[5] = (short)this->_VtxCurrentIdx + 3;
        this->_IdxWritePtr = this->_IdxWritePtr + 6;
        this->_VtxCurrentIdx = this->_VtxCurrentIdx + 4;
      }
    }
    else {
      uVar4 = col & 0xffffff;
      if (bVar2) {
        local_1e0 = points_count << 2;
      }
      else {
        local_1e0 = points_count * 3;
      }
      PrimReserve(in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98);
      lVar3 = -((long)(int)(points_count * ((uint)bVar2 * 2 + 3)) * 8 + 0xfU & 0xfffffffffffffff0);
      puVar6 = (undefined8 *)((long)&IStack_278 + lVar3);
      pIVar7 = (ImVec2 *)(puVar6 + points_count);
      for (dx = 0.0; (int)dx < (int)AA_SIZE; dx = (float)((int)dx + 1)) {
        if ((int)dx + 1 == points_count) {
          local_1e4 = 0;
        }
        else {
          local_1e4 = (int)dx + 1;
        }
        d2 = points[local_1e4].x - points[(int)dx].x;
        inv_len = points[local_1e4].y - points[(int)dx].y;
        if (0.0 < d2 * d2 + inv_len * inv_len) {
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar3) = 0x16174e;
          fVar11 = ImSqrt(*(float *)(&stack0xfffffffffffffd84 + lVar3));
          d2 = (1.0 / fVar11) * d2;
          inv_len = (1.0 / fVar11) * inv_len;
        }
        *(float *)(puVar6 + (int)dx) = inv_len;
        *(float *)((long)&IStack_278 + (long)(int)dx * 8 + lVar3 + 4) = -d2;
      }
      if (!closed) {
        puVar6[points_count + -1] = puVar6[points_count + -2];
      }
      if (bVar2) {
        fVar11 = (thickness - 1.0) * 0.5;
        if (!closed) {
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar3) = 0x161e63;
          operator*((ImVec2 *)*puVar6,*(float *)(&stack0xfffffffffffffd84 + lVar3));
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar3) = 0x161e7e;
          IVar14 = operator+((ImVec2 *)*puVar6,*(ImVec2 **)(&stack0xfffffffffffffd80 + lVar3));
          *pIVar7 = IVar14;
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar3) = 0x161eb0;
          operator*((ImVec2 *)*puVar6,*(float *)(&stack0xfffffffffffffd84 + lVar3));
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar3) = 0x161ecb;
          IVar14 = operator+((ImVec2 *)*puVar6,*(ImVec2 **)(&stack0xfffffffffffffd80 + lVar3));
          pIVar7[1] = IVar14;
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar3) = 0x161efe;
          operator*((ImVec2 *)*puVar6,*(float *)(&stack0xfffffffffffffd84 + lVar3));
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar3) = 0x161f19;
          IVar14 = operator-((ImVec2 *)*puVar6,*(ImVec2 **)(&stack0xfffffffffffffd80 + lVar3));
          pIVar7[2] = IVar14;
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar3) = 0x161f58;
          operator*((ImVec2 *)*puVar6,*(float *)(&stack0xfffffffffffffd84 + lVar3));
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar3) = 0x161f73;
          IVar14 = operator-((ImVec2 *)*puVar6,*(ImVec2 **)(&stack0xfffffffffffffd80 + lVar3));
          pIVar7[3] = IVar14;
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar3) = 0x161fc2;
          operator*((ImVec2 *)*puVar6,*(float *)(&stack0xfffffffffffffd84 + lVar3));
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar3) = 0x161fdd;
          IVar14 = operator+((ImVec2 *)*puVar6,*(ImVec2 **)(&stack0xfffffffffffffd80 + lVar3));
          pIVar7[points_count * 4 + -4] = IVar14;
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar3) = 0x16202f;
          operator*((ImVec2 *)*puVar6,*(float *)(&stack0xfffffffffffffd84 + lVar3));
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar3) = 0x16204a;
          IVar14 = operator+((ImVec2 *)*puVar6,*(ImVec2 **)(&stack0xfffffffffffffd80 + lVar3));
          pIVar7[(long)(points_count * 4 + -4) + 1] = IVar14;
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar3) = 0x16209d;
          operator*((ImVec2 *)*puVar6,*(float *)(&stack0xfffffffffffffd84 + lVar3));
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar3) = 0x1620b8;
          IVar14 = operator-((ImVec2 *)*puVar6,*(ImVec2 **)(&stack0xfffffffffffffd80 + lVar3));
          pIVar7[(long)(points_count * 4 + -4) + 2] = IVar14;
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar3) = 0x162117;
          operator*((ImVec2 *)*puVar6,*(float *)(&stack0xfffffffffffffd84 + lVar3));
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar3) = 0x162132;
          IVar14 = operator-((ImVec2 *)*puVar6,*(ImVec2 **)(&stack0xfffffffffffffd80 + lVar3));
          pIVar7[(points_count + -1) * 4 + 3] = IVar14;
        }
        i2_2 = this->_VtxCurrentIdx;
        for (idx2_1 = 0; (int)idx2_1 < (int)AA_SIZE; idx2_1 = idx2_1 + 1) {
          if (idx2_1 + 1 == points_count) {
            iVar15 = 0;
          }
          else {
            iVar15 = idx2_1 + 1;
          }
          if (idx2_1 + 1 == points_count) {
            uVar5 = this->_VtxCurrentIdx;
          }
          else {
            uVar5 = i2_2 + 4;
          }
          d2_2 = (*(float *)(puVar6 + (int)idx2_1) + *(float *)(puVar6 + iVar15)) * 0.5;
          inv_len_2 = (*(float *)((long)&IStack_278 + (long)(int)idx2_1 * 8 + lVar3 + 4) +
                      *(float *)((long)&IStack_278 + (long)iVar15 * 8 + lVar3 + 4)) * 0.5;
          if (1e-06 < d2_2 * d2_2 + inv_len_2 * inv_len_2) {
            *(undefined8 *)(&stack0xfffffffffffffd80 + lVar3) = 0x1622ab;
            fVar12 = ImSqrt(*(float *)(&stack0xfffffffffffffd84 + lVar3));
            dm_out_y = 1.0 / fVar12;
            if (100.0 < dm_out_y) {
              dm_out_y = 100.0;
            }
            d2_2 = dm_out_y * d2_2;
            inv_len_2 = dm_out_y * inv_len_2;
          }
          fVar12 = d2_2 * (fVar11 + 1.0);
          fVar13 = inv_len_2 * (fVar11 + 1.0);
          pIVar10 = pIVar7 + (iVar15 << 2);
          pIVar10->x = points[iVar15].x + fVar12;
          pIVar10->y = points[iVar15].y + fVar13;
          pIVar10[1].x = points[iVar15].x + d2_2 * fVar11;
          pIVar10[1].y = points[iVar15].y + inv_len_2 * fVar11;
          pIVar10[2].x = points[iVar15].x - d2_2 * fVar11;
          pIVar10[2].y = points[iVar15].y - inv_len_2 * fVar11;
          pIVar10[3].x = points[iVar15].x - fVar12;
          pIVar10[3].y = points[iVar15].y - fVar13;
          IVar8 = (ImDrawIdx)uVar5;
          *this->_IdxWritePtr = IVar8 + 1;
          IVar9 = (ImDrawIdx)i2_2;
          this->_IdxWritePtr[1] = IVar9 + 1;
          this->_IdxWritePtr[2] = IVar9 + 2;
          this->_IdxWritePtr[3] = IVar9 + 2;
          this->_IdxWritePtr[4] = IVar8 + 2;
          this->_IdxWritePtr[5] = IVar8 + 1;
          this->_IdxWritePtr[6] = IVar8 + 1;
          this->_IdxWritePtr[7] = IVar9 + 1;
          this->_IdxWritePtr[8] = IVar9;
          this->_IdxWritePtr[9] = IVar9;
          this->_IdxWritePtr[10] = IVar8;
          this->_IdxWritePtr[0xb] = IVar8 + 1;
          this->_IdxWritePtr[0xc] = IVar8 + 2;
          this->_IdxWritePtr[0xd] = IVar9 + 2;
          this->_IdxWritePtr[0xe] = IVar9 + 3;
          this->_IdxWritePtr[0xf] = IVar9 + 3;
          this->_IdxWritePtr[0x10] = IVar8 + 3;
          this->_IdxWritePtr[0x11] = IVar8 + 2;
          this->_IdxWritePtr = this->_IdxWritePtr + 0x12;
          i2_2 = uVar5;
        }
        for (vtx_count_1 = 0; vtx_count_1 < points_count; vtx_count_1 = vtx_count_1 + 1) {
          this->_VtxWritePtr->pos = pIVar7[vtx_count_1 << 2];
          this->_VtxWritePtr->uv = IVar1;
          this->_VtxWritePtr->col = uVar4;
          this->_VtxWritePtr[1].pos = pIVar7[vtx_count_1 * 4 + 1];
          this->_VtxWritePtr[1].uv = IVar1;
          this->_VtxWritePtr[1].col = col;
          this->_VtxWritePtr[2].pos = pIVar7[vtx_count_1 * 4 + 2];
          this->_VtxWritePtr[2].uv = IVar1;
          this->_VtxWritePtr[2].col = col;
          this->_VtxWritePtr[3].pos = pIVar7[vtx_count_1 * 4 + 3];
          this->_VtxWritePtr[3].uv = IVar1;
          this->_VtxWritePtr[3].col = uVar4;
          this->_VtxWritePtr = this->_VtxWritePtr + 4;
        }
      }
      else {
        if (!closed) {
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar3) = 0x161820;
          operator*((ImVec2 *)*puVar6,*(float *)(&stack0xfffffffffffffd84 + lVar3));
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar3) = 0x161835;
          IVar14 = operator+((ImVec2 *)*puVar6,*(ImVec2 **)(&stack0xfffffffffffffd80 + lVar3));
          *pIVar7 = IVar14;
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar3) = 0x161864;
          operator*((ImVec2 *)*puVar6,*(float *)(&stack0xfffffffffffffd84 + lVar3));
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar3) = 0x16187f;
          IVar14 = operator-((ImVec2 *)*puVar6,*(ImVec2 **)(&stack0xfffffffffffffd80 + lVar3));
          pIVar7[1] = IVar14;
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar3) = 0x1618bf;
          operator*((ImVec2 *)*puVar6,*(float *)(&stack0xfffffffffffffd84 + lVar3));
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar3) = 0x1618da;
          IVar14 = operator+((ImVec2 *)*puVar6,*(ImVec2 **)(&stack0xfffffffffffffd80 + lVar3));
          pIVar7[points_count * 2 + -2] = IVar14;
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar3) = 0x16192c;
          operator*((ImVec2 *)*puVar6,*(float *)(&stack0xfffffffffffffd84 + lVar3));
          *(undefined8 *)(&stack0xfffffffffffffd80 + lVar3) = 0x161947;
          IVar14 = operator-((ImVec2 *)*puVar6,*(ImVec2 **)(&stack0xfffffffffffffd80 + lVar3));
          pIVar7[(points_count + -1) * 2 + 1] = IVar14;
        }
        i2_1 = this->_VtxCurrentIdx;
        for (idx2 = 0; (int)idx2 < (int)AA_SIZE; idx2 = idx2 + 1) {
          if (idx2 + 1 == points_count) {
            local_214 = 0;
          }
          else {
            local_214 = idx2 + 1;
          }
          if (idx2 + 1 == points_count) {
            local_218 = this->_VtxCurrentIdx;
          }
          else {
            local_218 = i2_1 + 3;
          }
          d2_1 = (*(float *)(puVar6 + (int)idx2) + *(float *)(puVar6 + local_214)) * 0.5;
          inv_len_1 = (*(float *)((long)&IStack_278 + (long)(int)idx2 * 8 + lVar3 + 4) +
                      *(float *)((long)&IStack_278 + (long)local_214 * 8 + lVar3 + 4)) * 0.5;
          if (1e-06 < d2_1 * d2_1 + inv_len_1 * inv_len_1) {
            *(undefined8 *)(&stack0xfffffffffffffd80 + lVar3) = 0x161abf;
            fVar11 = ImSqrt(*(float *)(&stack0xfffffffffffffd84 + lVar3));
            out_vtx._0_4_ = 1.0 / fVar11;
            if (100.0 < out_vtx._0_4_) {
              out_vtx._0_4_ = 100.0;
            }
            d2_1 = out_vtx._0_4_ * d2_1;
            inv_len_1 = out_vtx._0_4_ * inv_len_1;
          }
          pIVar10 = pIVar7 + (local_214 << 1);
          pIVar10->x = points[local_214].x + d2_1 * 1.0;
          pIVar10->y = points[local_214].y + inv_len_1 * 1.0;
          pIVar10[1].x = points[local_214].x - d2_1 * 1.0;
          pIVar10[1].y = points[local_214].y - inv_len_1 * 1.0;
          IVar8 = (ImDrawIdx)local_218;
          *this->_IdxWritePtr = IVar8;
          IVar9 = (ImDrawIdx)i2_1;
          this->_IdxWritePtr[1] = IVar9;
          this->_IdxWritePtr[2] = IVar9 + 2;
          this->_IdxWritePtr[3] = IVar9 + 2;
          this->_IdxWritePtr[4] = IVar8 + 2;
          this->_IdxWritePtr[5] = IVar8;
          this->_IdxWritePtr[6] = IVar8 + 1;
          this->_IdxWritePtr[7] = IVar9 + 1;
          this->_IdxWritePtr[8] = IVar9;
          this->_IdxWritePtr[9] = IVar9;
          this->_IdxWritePtr[10] = IVar8;
          this->_IdxWritePtr[0xb] = IVar8 + 1;
          this->_IdxWritePtr = this->_IdxWritePtr + 0xc;
          i2_1 = local_218;
        }
        for (local_dc = 0; local_dc < points_count; local_dc = local_dc + 1) {
          this->_VtxWritePtr->pos = points[local_dc];
          this->_VtxWritePtr->uv = IVar1;
          this->_VtxWritePtr->col = col;
          this->_VtxWritePtr[1].pos = pIVar7[local_dc << 1];
          this->_VtxWritePtr[1].uv = IVar1;
          this->_VtxWritePtr[1].col = uVar4;
          this->_VtxWritePtr[2].pos = pIVar7[local_dc * 2 + 1];
          this->_VtxWritePtr[2].uv = IVar1;
          this->_VtxWritePtr[2].col = uVar4;
          this->_VtxWritePtr = this->_VtxWritePtr + 3;
        }
      }
      this->_VtxCurrentIdx = (local_1e0 & 0xffff) + this->_VtxCurrentIdx;
    }
  }
  return;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, bool closed, float thickness)
{
    if (points_count < 2)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;

    int count = points_count;
    if (!closed)
        count = points_count-1;

    const bool thick_line = thickness > 1.0f;
    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = 1.0f;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        const int idx_count = thick_line ? count*18 : count*12;
        const int vtx_count = thick_line ? points_count*4 : points_count*3;
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * (thick_line ? 5 : 3) * sizeof(ImVec2));
        ImVec2* temp_points = temp_normals + points_count;

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            float dx = points[i2].x - points[i1].x;
            float dy = points[i2].y - points[i1].y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i1].x = dy;
            temp_normals[i1].y = -dx;
        }
        if (!closed)
            temp_normals[points_count-1] = temp_normals[points_count-2];

        if (!thick_line)
        {
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * AA_SIZE;
                temp_points[1] = points[0] - temp_normals[0] * AA_SIZE;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * AA_SIZE;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * AA_SIZE;
            }

            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx;
            for (int i1 = 0; i1 < count; i1++)
            {
                const int i2 = (i1+1) == points_count ? 0 : i1+1;
                unsigned int idx2 = (i1+1) == points_count ? _VtxCurrentIdx : idx1+3;

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_NORMALIZE2F_OVER_EPSILON_CLAMP(dm_x, dm_y, 0.000001f, 100.0f)
                dm_x *= AA_SIZE;
                dm_y *= AA_SIZE;

                // Add temporary vertexes
                ImVec2* out_vtx = &temp_points[i2*2];
                out_vtx[0].x = points[i2].x + dm_x;
                out_vtx[0].y = points[i2].y + dm_y;
                out_vtx[1].x = points[i2].x - dm_x;
                out_vtx[1].y = points[i2].y - dm_y;

                // Add indexes
                _IdxWritePtr[0] = (ImDrawIdx)(idx2+0); _IdxWritePtr[1] = (ImDrawIdx)(idx1+0); _IdxWritePtr[2] = (ImDrawIdx)(idx1+2);
                _IdxWritePtr[3] = (ImDrawIdx)(idx1+2); _IdxWritePtr[4] = (ImDrawIdx)(idx2+2); _IdxWritePtr[5] = (ImDrawIdx)(idx2+0);
                _IdxWritePtr[6] = (ImDrawIdx)(idx2+1); _IdxWritePtr[7] = (ImDrawIdx)(idx1+1); _IdxWritePtr[8] = (ImDrawIdx)(idx1+0);
                _IdxWritePtr[9] = (ImDrawIdx)(idx1+0); _IdxWritePtr[10]= (ImDrawIdx)(idx2+0); _IdxWritePtr[11]= (ImDrawIdx)(idx2+1);
                _IdxWritePtr += 12;

                idx1 = idx2;
            }

            // Add vertexes
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = points[i];          _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
                _VtxWritePtr[1].pos = temp_points[i*2+0]; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;
                _VtxWritePtr[2].pos = temp_points[i*2+1]; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col_trans;
                _VtxWritePtr += 3;
            }
        }
        else
        {
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[(points_count-1)*4+0] = points[points_count-1] + temp_normals[points_count-1] * (half_inner_thickness + AA_SIZE);
                temp_points[(points_count-1)*4+1] = points[points_count-1] + temp_normals[points_count-1] * (half_inner_thickness);
                temp_points[(points_count-1)*4+2] = points[points_count-1] - temp_normals[points_count-1] * (half_inner_thickness);
                temp_points[(points_count-1)*4+3] = points[points_count-1] - temp_normals[points_count-1] * (half_inner_thickness + AA_SIZE);
            }

            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx;
            for (int i1 = 0; i1 < count; i1++)
            {
                const int i2 = (i1+1) == points_count ? 0 : i1+1;
                unsigned int idx2 = (i1+1) == points_count ? _VtxCurrentIdx : idx1+4;

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_NORMALIZE2F_OVER_EPSILON_CLAMP(dm_x, dm_y, 0.000001f, 100.0f);
                float dm_out_x = dm_x * (half_inner_thickness + AA_SIZE);
                float dm_out_y = dm_y * (half_inner_thickness + AA_SIZE);
                float dm_in_x = dm_x * half_inner_thickness;
                float dm_in_y = dm_y * half_inner_thickness;

                // Add temporary vertexes
                ImVec2* out_vtx = &temp_points[i2*4];
                out_vtx[0].x = points[i2].x + dm_out_x;
                out_vtx[0].y = points[i2].y + dm_out_y;
                out_vtx[1].x = points[i2].x + dm_in_x;
                out_vtx[1].y = points[i2].y + dm_in_y;
                out_vtx[2].x = points[i2].x - dm_in_x;
                out_vtx[2].y = points[i2].y - dm_in_y;
                out_vtx[3].x = points[i2].x - dm_out_x;
                out_vtx[3].y = points[i2].y - dm_out_y;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2+1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1+1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1+2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1+2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2+2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2+1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2+1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1+1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1+0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1+0); _IdxWritePtr[10] = (ImDrawIdx)(idx2+0); _IdxWritePtr[11] = (ImDrawIdx)(idx2+1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2+2); _IdxWritePtr[13] = (ImDrawIdx)(idx1+2); _IdxWritePtr[14] = (ImDrawIdx)(idx1+3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1+3); _IdxWritePtr[16] = (ImDrawIdx)(idx2+3); _IdxWritePtr[17] = (ImDrawIdx)(idx2+2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertexes
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i*4+0]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i*4+1]; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i*4+2]; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i*4+3]; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Stroke
        const int idx_count = count*6;
        const int vtx_count = count*4;      // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= (thickness * 0.5f);
            dy *= (thickness * 0.5f);

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx+1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx+2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx+2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx+3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}